

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage_example.cxx
# Opt level: O0

void test_basic_usage<ThreadSafeDerived>(void)

{
  bool bVar1;
  ThreadSafeDerived *this;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  undefined8 local_3c9;
  Result local_3c0;
  undefined1 local_3b0 [8];
  ResultBuilder _DOCTEST_RB_8;
  undefined8 local_359;
  Result local_350;
  undefined1 local_340 [8];
  ResultBuilder _DOCTEST_RB_7;
  ExpressionDecomposer local_2f8 [8];
  Result local_2f0;
  undefined1 local_2e0 [8];
  ResultBuilder _DOCTEST_RB_6;
  undefined8 local_289;
  Result local_280;
  undefined1 local_270 [8];
  ResultBuilder _DOCTEST_RB_5;
  ExpressionDecomposer local_228 [8];
  Result local_220;
  undefined1 local_210 [8];
  ResultBuilder _DOCTEST_RB_4;
  TPtr pt3;
  undefined8 local_1b1;
  Result local_1a8;
  undefined1 local_198 [8];
  ResultBuilder _DOCTEST_RB_3;
  ExpressionDecomposer local_150 [8];
  Result local_148;
  undefined1 local_138 [8];
  ResultBuilder _DOCTEST_RB_2;
  TPtr ptr2;
  undefined8 local_d9;
  Result local_d0;
  undefined1 local_c0 [8];
  ResultBuilder _DOCTEST_RB_1;
  ExpressionDecomposer local_78 [8];
  Result local_70;
  undefined1 local_60 [8];
  ResultBuilder _DOCTEST_RB;
  retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_> local_10;
  TPtr ptr;
  
  this = (ThreadSafeDerived *)operator_new(8);
  ThreadSafeDerived::ThreadSafeDerived(this);
  sg14::retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_>::retain_ptr
            (&local_10,this);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_60,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x23,"T::numInstances == 1","");
    doctest::detail::ExpressionDecomposer::operator<<(local_78,(long *)&_DOCTEST_RB_1.field_0x3f);
    _DOCTEST_RB_1.m_threw = true;
    _DOCTEST_RB_1.m_threw_as = false;
    _DOCTEST_RB_1.m_failed = false;
    _DOCTEST_RB_1._59_1_ = 0;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_70,(int *)local_78);
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_60,&local_70);
    doctest::detail::Result::~Result(&local_70);
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_60,__x);
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_60);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_60);
    bVar1 = doctest::detail::always_false();
  } while (bVar1);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_c0,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x24,"ptr.use_count() == 1","");
    sg14::retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_>::use_count
              (&local_10);
    doctest::detail::ExpressionDecomposer::operator<<
              ((ExpressionDecomposer *)((long)&local_d9 + 1),&local_d9);
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_d0,(int *)((long)&local_d9 + 1));
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_c0,&local_d0);
    doctest::detail::Result::~Result(&local_d0);
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_c0,__x_00);
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_c0);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_c0);
    bVar1 = doctest::detail::always_false();
  } while (bVar1);
  sg14::retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_>::retain_ptr
            ((retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_> *)
             &_DOCTEST_RB_2.m_threw,&local_10);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_138,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x27,"T::numInstances == 1","");
    doctest::detail::ExpressionDecomposer::operator<<(local_150,(long *)&_DOCTEST_RB_3.field_0x3f);
    _DOCTEST_RB_3.m_threw = true;
    _DOCTEST_RB_3.m_threw_as = false;
    _DOCTEST_RB_3.m_failed = false;
    _DOCTEST_RB_3._59_1_ = 0;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_148,(int *)local_150);
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_138,&local_148);
    doctest::detail::Result::~Result(&local_148);
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_138,__x_01);
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_138);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_138);
    bVar1 = doctest::detail::always_false();
  } while (bVar1);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_198,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x28,"ptr.use_count() == 2","");
    sg14::retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_>::use_count
              (&local_10);
    doctest::detail::ExpressionDecomposer::operator<<
              ((ExpressionDecomposer *)((long)&local_1b1 + 1),&local_1b1);
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_1a8,(int *)((long)&local_1b1 + 1));
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_198,&local_1a8);
    doctest::detail::Result::~Result(&local_1a8);
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_198,__x_02);
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_198);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_198);
    bVar1 = doctest::detail::always_false();
  } while (bVar1);
  sg14::retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_>::retain_ptr
            ((retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_> *)
             &_DOCTEST_RB_4.m_threw,
             (retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_> *)
             &_DOCTEST_RB_2.m_threw);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_210,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x2a,"T::numInstances == 1","");
    doctest::detail::ExpressionDecomposer::operator<<(local_228,(long *)&_DOCTEST_RB_5.field_0x3f);
    _DOCTEST_RB_5.m_threw = true;
    _DOCTEST_RB_5.m_threw_as = false;
    _DOCTEST_RB_5.m_failed = false;
    _DOCTEST_RB_5._59_1_ = 0;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_220,(int *)local_228);
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_210,&local_220);
    doctest::detail::Result::~Result(&local_220);
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_210,__x_03);
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_210);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_210);
    bVar1 = doctest::detail::always_false();
  } while (bVar1);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_270,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x2b,"ptr.use_count() == 2","");
    sg14::retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_>::use_count
              (&local_10);
    doctest::detail::ExpressionDecomposer::operator<<
              ((ExpressionDecomposer *)((long)&local_289 + 1),&local_289);
    _DOCTEST_RB_6._60_4_ = 2;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_280,(int *)((long)&local_289 + 1));
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_270,&local_280);
    doctest::detail::Result::~Result(&local_280);
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_270,__x_04);
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_270);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_270);
    bVar1 = doctest::detail::always_false();
  } while (bVar1);
  sg14::retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_>::~retain_ptr
            ((retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_> *)
             &_DOCTEST_RB_4.m_threw);
  sg14::retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_>::~retain_ptr
            ((retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_> *)
             &_DOCTEST_RB_2.m_threw);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_2e0,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x2d,"T::numInstances == 1","");
    doctest::detail::ExpressionDecomposer::operator<<(local_2f8,(long *)&_DOCTEST_RB_7.field_0x3f);
    _DOCTEST_RB_7.m_threw = true;
    _DOCTEST_RB_7.m_threw_as = false;
    _DOCTEST_RB_7.m_failed = false;
    _DOCTEST_RB_7._59_1_ = 0;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_2f0,(int *)local_2f8);
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_2e0,&local_2f0);
    doctest::detail::Result::~Result(&local_2f0);
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_2e0,__x_05);
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_2e0);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_2e0);
    bVar1 = doctest::detail::always_false();
  } while (bVar1);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_340,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x2e,"ptr.use_count() == 1","");
    sg14::retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_>::use_count
              (&local_10);
    doctest::detail::ExpressionDecomposer::operator<<
              ((ExpressionDecomposer *)((long)&local_359 + 1),&local_359);
    _DOCTEST_RB_8._60_4_ = 1;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_350,(int *)((long)&local_359 + 1));
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_340,&local_350);
    doctest::detail::Result::~Result(&local_350);
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_340,__x_06);
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_340);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_340);
    bVar1 = doctest::detail::always_false();
  } while (bVar1);
  sg14::retain_ptr<ThreadSafeDerived,_sg14::retain_traits<ThreadSafeDerived>_>::~retain_ptr
            (&local_10);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_3b0,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x30,"T::numInstances == 0","");
    doctest::detail::ExpressionDecomposer::operator<<
              ((ExpressionDecomposer *)((long)&local_3c9 + 1),&local_3c9);
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_3c0,(int *)((long)&local_3c9 + 1));
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_3b0,&local_3c0);
    doctest::detail::Result::~Result(&local_3c0);
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_3b0,__x_07);
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_3b0);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_3b0);
    bVar1 = doctest::detail::always_false();
  } while (bVar1);
  return;
}

Assistant:

void test_basic_usage()
{
  using TPtr = sg14::retain_ptr<T>;
  {
    TPtr ptr{new T};
    REQUIRE(T::numInstances == 1);
    REQUIRE(ptr.use_count() == 1);
    {
      TPtr ptr2{ptr};
      REQUIRE(T::numInstances == 1);
      REQUIRE(ptr.use_count() == 2);
      TPtr pt3{std::move(ptr2)};
      REQUIRE(T::numInstances == 1);
      REQUIRE(ptr.use_count() == 2);
    }
    REQUIRE(T::numInstances == 1);
    REQUIRE(ptr.use_count() == 1);
  }
  REQUIRE(T::numInstances == 0);
}